

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request_queue_impl_qwqr.cpp
# Opt level: O1

void * foxxll::request_queue_impl_qwqr::worker(void *arg)

{
  _List_node_base *this;
  _List_node_base *this_00;
  Semaphore *this_01;
  _List_node_base *p_Var1;
  __pid_t _Var2;
  long *plVar3;
  undefined4 extraout_var;
  __sighandler_t __handler;
  __sighandler_t __handler_00;
  __sighandler_t __handler_01;
  int iVar4;
  bool bVar5;
  request_ptr req;
  unique_lock<std::mutex> write_lock;
  CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> local_68;
  unique_lock<std::mutex> local_60;
  shared_state<foxxll::request_queue_impl_worker::thread_state> *local_50;
  mutex_type *local_48;
  mutex_type *local_40;
  void *local_38;
  
  this_01 = (Semaphore *)((long)arg + 0xf0);
  local_40 = (mutex_type *)((long)arg + 0x30);
  this = (_List_node_base *)((long)arg + 0x70);
  local_48 = (mutex_type *)((long)arg + 8);
  this_00 = (_List_node_base *)((long)arg + 0x58);
  local_50 = (shared_state<foxxll::request_queue_impl_worker::thread_state> *)((long)arg + 0x88);
  bVar5 = true;
  local_38 = arg;
  while( true ) {
    do {
      iVar4 = 1;
      tlx::Semaphore::wait(this_01,(void *)0x1);
      if (bVar5) {
        local_60._M_device = local_48;
        local_60._M_owns = false;
        std::unique_lock<std::mutex>::lock(&local_60);
        local_60._M_owns = true;
        p_Var1 = (((_List_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                    *)&this_00->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        if (p_Var1 == this_00) {
          std::unique_lock<std::mutex>::unlock(&local_60);
          tlx::Semaphore::signal(this_01,iVar4,__handler);
          bVar5 = false;
        }
        else {
          local_68.ptr_ = (request *)p_Var1[1]._M_next;
          if (local_68.ptr_ != (request *)0x0) {
            LOCK();
            ((local_68.ptr_)->super_reference_counter).reference_count_.
            super___atomic_base<unsigned_long>._M_i =
                 (__int_type)
                 ((long)&((_List_node_base *)
                         ((local_68.ptr_)->super_reference_counter).reference_count_.
                         super___atomic_base<unsigned_long>._M_i)->_M_next + 1);
            UNLOCK();
          }
          std::__cxx11::
          list<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
          ::_M_erase((list<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                      *)this_00,this_00->_M_next);
          std::unique_lock<std::mutex>::unlock(&local_60);
          plVar3 = (long *)__dynamic_cast(local_68.ptr_,&request::typeinfo,
                                          &serving_request::typeinfo,0);
          (**(code **)(*plVar3 + 0x58))(plVar3);
          tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::dec_reference
                    (&local_68);
        }
        std::unique_lock<std::mutex>::~unique_lock(&local_60);
      }
      else {
        local_60._M_device = local_40;
        local_60._M_owns = false;
        std::unique_lock<std::mutex>::lock(&local_60);
        local_60._M_owns = true;
        p_Var1 = (((_List_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                    *)&this->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        if (p_Var1 == this) {
          std::unique_lock<std::mutex>::unlock(&local_60);
          tlx::Semaphore::signal(this_01,iVar4,__handler_00);
        }
        else {
          local_68.ptr_ = (request *)p_Var1[1]._M_next;
          if (local_68.ptr_ != (request *)0x0) {
            LOCK();
            ((local_68.ptr_)->super_reference_counter).reference_count_.
            super___atomic_base<unsigned_long>._M_i =
                 (__int_type)
                 ((long)&((_List_node_base *)
                         ((local_68.ptr_)->super_reference_counter).reference_count_.
                         super___atomic_base<unsigned_long>._M_i)->_M_next + 1);
            UNLOCK();
          }
          std::__cxx11::
          list<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
          ::_M_erase((list<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                      *)this,this->_M_next);
          std::unique_lock<std::mutex>::unlock(&local_60);
          plVar3 = (long *)__dynamic_cast(local_68.ptr_,&request::typeinfo,
                                          &serving_request::typeinfo,0);
          (**(code **)(*plVar3 + 0x58))(plVar3);
          tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::dec_reference
                    (&local_68);
        }
        std::unique_lock<std::mutex>::~unique_lock(&local_60);
        bVar5 = true;
      }
      local_60._M_device = &local_50->mutex_;
      local_60._M_owns = false;
      std::unique_lock<std::mutex>::lock(&local_60);
      local_60._M_owns = true;
      iVar4 = *(int *)((long)local_38 + 0xe0);
      std::unique_lock<std::mutex>::~unique_lock(&local_60);
    } while (iVar4 != 2);
    iVar4 = 1;
    _Var2 = tlx::Semaphore::wait(this_01,(void *)0x1);
    if (CONCAT44(extraout_var,_Var2) == 0) break;
    tlx::Semaphore::signal(this_01,iVar4,__handler_01);
  }
  local_60._M_device = (mutex_type *)CONCAT44(local_60._M_device._4_4_,3);
  shared_state<foxxll::request_queue_impl_worker::thread_state>::set_to
            (local_50,(value_type *)&local_60);
  return (void *)0x0;
}

Assistant:

void* request_queue_impl_qwqr::worker(void* arg)
{
    self* pthis = static_cast<self*>(arg);

    bool write_phase = true;
    for ( ; ; )
    {
        pthis->sem_.wait();

        if (write_phase)
        {
            std::unique_lock<std::mutex> write_lock(pthis->write_mutex_);
            if (!pthis->write_queue_.empty())
            {
                request_ptr req = pthis->write_queue_.front();
                pthis->write_queue_.pop_front();

                write_lock.unlock();

                //assert(req->get_reference_count()) > 1);
                dynamic_cast<serving_request*>(req.get())->serve();
            }
            else
            {
                write_lock.unlock();

                pthis->sem_.signal();

                if (pthis->priority_op_ == WRITE)
                    write_phase = false;
            }

            if (pthis->priority_op_ == NONE || pthis->priority_op_ == READ)
                write_phase = false;
        }
        else
        {
            std::unique_lock<std::mutex> read_lock(pthis->read_mutex_);

            if (!pthis->read_queue_.empty())
            {
                request_ptr req = pthis->read_queue_.front();
                pthis->read_queue_.pop_front();

                read_lock.unlock();

                TLX_LOG << "queue: before serve request has "
                        << req->reference_count() << " references ";
                //assert(req->get_reference_count() > 1);
                dynamic_cast<serving_request*>(req.get())->serve();
                TLX_LOG << "queue: after serve request has "
                        << req->reference_count() << " references ";
            }
            else
            {
                read_lock.unlock();

                pthis->sem_.signal();

                if (pthis->priority_op_ == READ)
                    write_phase = true;
            }

            if (pthis->priority_op_ == NONE || pthis->priority_op_ == WRITE)
                write_phase = true;
        }

        // terminate if it has been requested and queues are empty
        if (pthis->thread_state_() == TERMINATING) {
            if (pthis->sem_.wait() == 0)
                break;
            else
                pthis->sem_.signal();
        }
    }

    pthis->thread_state_.set_to(TERMINATED);

#if FOXXLL_MSVC >= 1700 && FOXXLL_MSVC <= 1800
    // Workaround for deadlock bug in Visual C++ Runtime 2012 and 2013, see
    // request_queue_impl_worker.cpp. -tb
    ExitThread(nullptr);
#else
    return nullptr;
#endif
}